

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * __thiscall
QUtil::qpdf_time_to_pdf_time_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,QPDFTime *qtm)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long *plVar4;
  size_type *psVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  int in_R8D;
  int iVar9;
  long lVar10;
  size_type sVar11;
  string tz_offset;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  string local_190;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  string local_150;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  uVar6 = *(uint *)(this + 0x18);
  if (uVar6 == 0) {
    iVar9 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,0x26169e);
  }
  else {
    if ((int)uVar6 < 0) {
      std::__cxx11::string::append((char *)&local_130);
      uVar6 = -uVar6;
    }
    else {
      std::__cxx11::string::append((char *)&local_130);
    }
    int_to_string_base_abi_cxx11_(&local_150,(QUtil *)((ulong)uVar6 / 0x3c),10,2,in_R8D);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_150);
    puVar3 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar3) {
      local_1a0 = *puVar3;
      lStack_198 = plVar1[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar3;
      local_1b0 = (ulong *)*plVar1;
    }
    local_1a8 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    int_to_string_base_abi_cxx11_(&local_190,(QUtil *)(ulong)(uVar6 % 0x3c),10,2,in_R8D);
    uVar7 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar7 = local_1a0;
    }
    if (uVar7 < local_190._M_string_length + local_1a8) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        uVar8 = local_190.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_190._M_string_length + local_1a8) goto LAB_0023f276;
      lVar10 = local_1a8;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0);
      iVar9 = (int)lVar10;
    }
    else {
LAB_0023f276:
      lVar10 = local_1a8;
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190._M_dataplus._M_p)
      ;
      iVar9 = (int)lVar10;
    }
    local_1d0 = &local_1c0;
    puVar3 = puVar2 + 2;
    if ((ulong *)*puVar2 == puVar3) {
      local_1c0 = *puVar3;
      uStack_1b8 = puVar2[3];
    }
    else {
      local_1c0 = *puVar3;
      local_1d0 = (ulong *)*puVar2;
    }
    local_1c8 = puVar2[1];
    *puVar2 = puVar3;
    puVar2[1] = 0;
    *(undefined1 *)puVar3 = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar1[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar1;
    }
    local_168 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,local_1c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  int_to_string_base_abi_cxx11_(&local_50,(QUtil *)(long)*(int *)this,10,4,iVar9);
  iVar9 = 2;
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x28193c);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_100 = *puVar3;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar3;
    local_110 = (ulong *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_70,(QUtil *)(long)*(int *)(this + 4),10,2,iVar9);
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < local_70._M_string_length + local_108) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar8 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_70._M_string_length + local_108) goto LAB_0023f4cb;
    lVar10 = local_108;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_110);
    iVar9 = (int)lVar10;
  }
  else {
LAB_0023f4cb:
    lVar10 = local_108;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_70._M_dataplus._M_p);
    iVar9 = (int)lVar10;
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  puVar3 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_190.field_2._M_allocated_capacity = *puVar3;
    local_190.field_2._8_8_ = puVar2[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *puVar3;
    local_190._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_190._M_string_length = puVar2[1];
  *puVar2 = puVar3;
  puVar2[1] = 0;
  *(undefined1 *)puVar3 = 0;
  int_to_string_base_abi_cxx11_(&local_90,(QUtil *)(long)*(int *)(this + 8),10,2,iVar9);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    uVar8 = local_190.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_90._M_string_length + local_190._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_190._M_string_length) goto LAB_0023f5a1;
    sVar11 = local_190._M_string_length;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  else {
LAB_0023f5a1:
    sVar11 = local_190._M_string_length;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_90._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  puVar3 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_150.field_2._M_allocated_capacity = *puVar3;
    local_150.field_2._8_8_ = puVar2[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *puVar3;
    local_150._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_150._M_string_length = puVar2[1];
  *puVar2 = puVar3;
  puVar2[1] = 0;
  *(undefined1 *)puVar3 = 0;
  int_to_string_base_abi_cxx11_(&local_b0,(QUtil *)(long)*(int *)(this + 0xc),10,2,iVar9);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    uVar8 = local_150.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_b0._M_string_length + local_150._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_b0._M_string_length + local_150._M_string_length) goto LAB_0023f686;
    sVar11 = local_150._M_string_length;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_150._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  else {
LAB_0023f686:
    sVar11 = local_150._M_string_length;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  local_1b0 = &local_1a0;
  puVar3 = puVar2 + 2;
  if ((ulong *)*puVar2 == puVar3) {
    local_1a0 = *puVar3;
    lStack_198 = puVar2[3];
  }
  else {
    local_1a0 = *puVar3;
    local_1b0 = (ulong *)*puVar2;
  }
  local_1a8 = puVar2[1];
  *puVar2 = puVar3;
  puVar2[1] = 0;
  *(undefined1 *)puVar3 = 0;
  int_to_string_base_abi_cxx11_(&local_d0,(QUtil *)(long)*(int *)(this + 0x10),10,2,iVar9);
  uVar7 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar7 = local_1a0;
  }
  if (uVar7 < local_d0._M_string_length + local_1a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_d0._M_string_length + local_1a8) goto LAB_0023f75e;
    lVar10 = local_1a8;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0);
    iVar9 = (int)lVar10;
  }
  else {
LAB_0023f75e:
    lVar10 = local_1a8;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_d0._M_dataplus._M_p);
    iVar9 = (int)lVar10;
  }
  local_1d0 = &local_1c0;
  puVar3 = puVar2 + 2;
  if ((ulong *)*puVar2 == puVar3) {
    local_1c0 = *puVar3;
    uStack_1b8 = puVar2[3];
  }
  else {
    local_1c0 = *puVar3;
    local_1d0 = (ulong *)*puVar2;
  }
  local_1c8 = puVar2[1];
  *puVar2 = puVar3;
  puVar2[1] = 0;
  *(undefined1 *)puVar3 = 0;
  int_to_string_base_abi_cxx11_(&local_f0,(QUtil *)(long)*(int *)(this + 0x14),10,2,iVar9);
  uVar7 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar7 = local_1c0;
  }
  if (uVar7 < local_f0._M_string_length + local_1c8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_1c8 <= (ulong)uVar8) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_1d0);
      goto LAB_0023f84e;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_f0._M_dataplus._M_p);
LAB_0023f84e:
  local_170 = &local_160;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_160 = *plVar1;
    lStack_158 = puVar2[3];
  }
  else {
    local_160 = *plVar1;
    local_170 = (long *)*puVar2;
  }
  local_168 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar5) {
    lVar10 = plVar1[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar1[1];
  *plVar1 = (long)psVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::qpdf_time_to_pdf_time(QPDFTime const& qtm)
{
    std::string tz_offset;
    int t = qtm.tz_delta;
    if (t == 0) {
        tz_offset = "Z";
    } else {
        if (t < 0) {
            t = -t;
            tz_offset += "+";
        } else {
            tz_offset += "-";
        }
        tz_offset += QUtil::int_to_string(t / 60, 2) + "'" + QUtil::int_to_string(t % 60, 2) + "'";
    }
    return (
        "D:" + QUtil::int_to_string(qtm.year, 4) + QUtil::int_to_string(qtm.month, 2) +
        QUtil::int_to_string(qtm.day, 2) + QUtil::int_to_string(qtm.hour, 2) +
        QUtil::int_to_string(qtm.minute, 2) + QUtil::int_to_string(qtm.second, 2) + tz_offset);
}